

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

bool __thiscall QIntersectionFinder::linesIntersect(QIntersectionFinder *this,QLineF *a,QLineF *b)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  double dVar7;
  qreal qVar8;
  qreal qVar9;
  double dVar10;
  qreal tq;
  qreal tp;
  qreal invPar;
  qreal tp2;
  qreal tp1;
  qreal dq;
  qreal tq2;
  qreal tq1;
  qreal dp;
  qreal par;
  bool p2_equals_q1;
  bool p1_equals_q2;
  bool p2_equals_q2;
  bool p1_equals_q1;
  QPointF normal;
  QPointF qDelta;
  QPointF pDelta;
  QPointF q2;
  QPointF q1;
  QPointF p2;
  QPointF p1;
  double in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  QLineF *in_stack_fffffffffffffe48;
  QPointF *in_stack_fffffffffffffe50;
  bool local_189;
  bool local_c9;
  QPointF local_78;
  QPointF local_68;
  QPointF local_58;
  QPointF local_48;
  QPointF local_38;
  QPointF local_28;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.yp = -NAN;
  local_18.xp = -NAN;
  local_18 = QLineF::p1(in_stack_fffffffffffffe48);
  local_28.yp = -NAN;
  local_28.xp = -NAN;
  local_28 = QLineF::p2(in_stack_fffffffffffffe48);
  local_38.yp = -NAN;
  local_38.xp = -NAN;
  local_38 = QLineF::p1(in_stack_fffffffffffffe48);
  local_48.yp = -NAN;
  local_48.xp = -NAN;
  local_48 = QLineF::p2(in_stack_fffffffffffffe48);
  bVar1 = comparePoints(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1);
  if ((bVar1) ||
     (bVar1 = comparePoints(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1), bVar1)) {
    local_c9 = false;
  }
  else {
    bVar1 = comparePoints(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1);
    bVar2 = comparePoints(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1);
    if ((bVar1) && (bVar2)) {
      local_c9 = true;
    }
    else {
      bVar1 = comparePoints(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1);
      bVar2 = comparePoints(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1);
      if ((bVar1) && (bVar2)) {
        local_c9 = true;
      }
      else {
        local_58.yp = -NAN;
        local_58.xp = -NAN;
        local_58 = ::operator-(&in_stack_fffffffffffffe48->pt1,
                               (QPointF *)
                               CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
        local_68.yp = -NAN;
        local_68.xp = -NAN;
        local_68 = ::operator-(&in_stack_fffffffffffffe48->pt1,
                               (QPointF *)
                               CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
        qVar3 = QPointF::x(&local_58);
        qVar4 = QPointF::y(&local_68);
        qVar5 = QPointF::y(&local_58);
        qVar6 = QPointF::x(&local_68);
        bVar1 = qFuzzyIsNull(in_stack_fffffffffffffe38);
        if (bVar1) {
          local_78.xp = -NAN;
          local_78.yp = -NAN;
          qVar3 = QPointF::y(&local_58);
          qVar4 = QPointF::x(&local_58);
          QPointF::QPointF(&local_78,-qVar3,qVar4);
          ::operator-(&in_stack_fffffffffffffe48->pt1,
                      (QPointF *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
          dot(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1);
          bVar1 = qFuzzyIsNull(in_stack_fffffffffffffe38);
          if (bVar1) {
            qVar3 = dot(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1);
            ::operator-(&in_stack_fffffffffffffe48->pt1,
                        (QPointF *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
            qVar4 = dot(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1);
            ::operator-(&in_stack_fffffffffffffe48->pt1,
                        (QPointF *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
            qVar5 = dot(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1);
            if (((0.0 < qVar4) && (qVar4 < qVar3)) || ((0.0 < qVar5 && (qVar5 < qVar3)))) {
              local_c9 = true;
              goto LAB_005cd1b0;
            }
            qVar3 = dot(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1);
            ::operator-(&in_stack_fffffffffffffe48->pt1,
                        (QPointF *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
            qVar4 = dot(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1);
            ::operator-(&in_stack_fffffffffffffe48->pt1,
                        (QPointF *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
            qVar5 = dot(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->pt1);
            if (((0.0 < qVar4) && (qVar4 < qVar3)) || ((0.0 < qVar5 && (qVar5 < qVar3)))) {
              local_c9 = true;
              goto LAB_005cd1b0;
            }
          }
          local_c9 = false;
        }
        else {
          dVar7 = 1.0 / (qVar3 * qVar4 + -(qVar5 * qVar6));
          qVar3 = QPointF::y(&local_68);
          qVar4 = QPointF::x(&local_38);
          qVar5 = QPointF::x(&local_18);
          qVar6 = QPointF::x(&local_68);
          qVar8 = QPointF::y(&local_38);
          qVar9 = QPointF::y(&local_18);
          dVar10 = (qVar3 * (qVar4 - qVar5) + -(qVar6 * (qVar8 - qVar9))) * dVar7;
          if ((dVar10 < 0.0) || (1.0 < dVar10)) {
            local_c9 = false;
          }
          else {
            qVar3 = QPointF::y(&local_58);
            qVar4 = QPointF::x(&local_38);
            qVar5 = QPointF::x(&local_18);
            qVar6 = QPointF::x(&local_58);
            qVar8 = QPointF::y(&local_38);
            qVar9 = QPointF::y(&local_18);
            dVar7 = (qVar3 * (qVar4 - qVar5) + -(qVar6 * (qVar8 - qVar9))) * dVar7;
            local_189 = 0.0 <= dVar7 && dVar7 <= 1.0;
            local_c9 = local_189;
          }
        }
      }
    }
  }
LAB_005cd1b0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c9;
  }
  __stack_chk_fail();
}

Assistant:

bool QIntersectionFinder::linesIntersect(const QLineF &a, const QLineF &b) const
{
    const QPointF p1 = a.p1();
    const QPointF p2 = a.p2();

    const QPointF q1 = b.p1();
    const QPointF q2 = b.p2();

    if (comparePoints(p1, p2) || comparePoints(q1, q2))
        return false;

    const bool p1_equals_q1 = comparePoints(p1, q1);
    const bool p2_equals_q2 = comparePoints(p2, q2);

    if (p1_equals_q1 && p2_equals_q2)
        return true;

    const bool p1_equals_q2 = comparePoints(p1, q2);
    const bool p2_equals_q1 = comparePoints(p2, q1);

    if (p1_equals_q2 && p2_equals_q1)
        return true;

    const QPointF pDelta = p2 - p1;
    const QPointF qDelta = q2 - q1;

    const qreal par = pDelta.x() * qDelta.y() - pDelta.y() * qDelta.x();

    if (qFuzzyIsNull(par)) {
        const QPointF normal(-pDelta.y(), pDelta.x());

        // coinciding?
        if (qFuzzyIsNull(dot(normal, q1 - p1))) {
            const qreal dp = dot(pDelta, pDelta);

            const qreal tq1 = dot(pDelta, q1 - p1);
            const qreal tq2 = dot(pDelta, q2 - p1);

            if ((tq1 > 0 && tq1 < dp) || (tq2 > 0 && tq2 < dp))
                return true;

            const qreal dq = dot(qDelta, qDelta);

            const qreal tp1 = dot(qDelta, p1 - q1);
            const qreal tp2 = dot(qDelta, p2 - q1);

            if ((tp1 > 0 && tp1 < dq) || (tp2 > 0 && tp2 < dq))
                return true;
        }

        return false;
    }

    const qreal invPar = 1 / par;

    const qreal tp = (qDelta.y() * (q1.x() - p1.x()) -
                      qDelta.x() * (q1.y() - p1.y())) * invPar;

    if (tp < 0 || tp > 1)
        return false;

    const qreal tq = (pDelta.y() * (q1.x() - p1.x()) -
                      pDelta.x() * (q1.y() - p1.y())) * invPar;

    return tq >= 0 && tq <= 1;
}